

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBidec.c
# Opt level: O0

Gia_Man_t * Gia_ManPerformBidec(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *vLeaves_00;
  Vec_Int_t *vTruth_00;
  Vec_Int_t *vVisited_00;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  bool bVar7;
  int local_74;
  Gia_Obj_t *pGStack_70;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vVisited;
  Vec_Int_t *vTruth;
  Vec_Int_t *vLeaves;
  Bdc_Par_t *pPars;
  int local_30;
  Bdc_Par_t Pars;
  Bdc_Man_t *pManDec;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  memset((void *)((long)&pPars + 4),0,0xc);
  pPars._4_4_ = Gia_ManLutSizeMax(p);
  local_30 = fVerbose;
  if (pPars._4_4_ < 2) {
    printf("Resynthesis is not performed when nodes have less than 2 inputs.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  else if (pPars._4_4_ < 0x10) {
    vLeaves_00 = Vec_IntAlloc(0);
    vTruth_00 = Vec_IntAlloc(0x10000);
    vVisited_00 = Vec_IntAlloc(0);
    Gia_ManCleanTruth(p);
    Gia_ManFillValue(p);
    pGVar5 = Gia_ManConst0(p);
    pGVar5->Value = 0;
    iVar1 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(iVar1);
    pcVar6 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar6;
    pcVar6 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar6;
    Gia_ManHashAlloc(p_00);
    Pars._4_8_ = Bdc_ManAlloc((Bdc_Par_t *)((long)&pPars + 4));
    local_74 = 1;
    while( true ) {
      bVar7 = false;
      if (local_74 < p->nObjs) {
        pGStack_70 = Gia_ManObj(p,local_74);
        bVar7 = pGStack_70 != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsCi(pGStack_70);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_70);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsLut(p,local_74);
          if (iVar1 != 0) {
            uVar3 = Gia_ObjPerformBidec((Bdc_Man_t *)Pars._4_8_,p_00,p,pGStack_70,vLeaves_00,
                                        vTruth_00,vVisited_00);
            pGStack_70->Value = uVar3;
          }
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(pGStack_70);
          uVar3 = Gia_ManAppendCo(p_00,iVar1);
          pGStack_70->Value = uVar3;
        }
      }
      else {
        uVar3 = Gia_ManAppendCi(p_00);
        pGStack_70->Value = uVar3;
      }
      local_74 = local_74 + 1;
    }
    Bdc_ManFree((Bdc_Man_t *)Pars._4_8_);
    Gia_ManHashStop(p_00);
    iVar1 = Gia_ManHasDangling(p_00);
    pTemp = p_00;
    if (iVar1 != 0) {
      pTemp = Gia_ManCleanup(p_00);
      iVar1 = Gia_ManAndNum(pTemp);
      iVar2 = Gia_ManAndNum(p_00);
      if (iVar1 != iVar2) {
        uVar3 = Gia_ManAndNum(pTemp);
        uVar4 = Gia_ManAndNum(p_00);
        printf("Gia_ManPerformBidec() node count before and after: %6d and %6d.\n",(ulong)uVar3,
               (ulong)uVar4);
      }
      Gia_ManStop(p_00);
    }
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(pTemp,iVar1);
    Vec_IntFree(vLeaves_00);
    Vec_IntFree(vTruth_00);
    Vec_IntFree(vVisited_00);
    p_local = pTemp;
  }
  else {
    printf("Resynthesis is not performed when nodes have more than 15 inputs.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManPerformBidec( Gia_Man_t * p, int fVerbose )
{
    Bdc_Man_t * pManDec;
    Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Vec_Int_t * vLeaves, * vTruth, * vVisited;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;//, clk = Abc_Clock();
    pPars->nVarsMax = Gia_ManLutSizeMax( p );
    pPars->fVerbose = fVerbose;
    if ( pPars->nVarsMax < 2 )
    {
        printf( "Resynthesis is not performed when nodes have less than 2 inputs.\n" );
        return NULL;
    }
    if ( pPars->nVarsMax > 15 )
    {
        printf( "Resynthesis is not performed when nodes have more than 15 inputs.\n" );
        return NULL;
    }
    vLeaves  = Vec_IntAlloc( 0 );
    vTruth   = Vec_IntAlloc( (1<<16) );
    vVisited = Vec_IntAlloc( 0 );
    // clean the old manager
    Gia_ManCleanTruth( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
//    Gia_ManCleanLevels( pNew, Gia_ManObjNum(p) );
    pManDec = Bdc_ManAlloc( pPars );
    Gia_ManForEachObj1( p, pObj, i )
    {        
        if ( Gia_ObjIsCi(pObj) ) // transfer the CI level (is it needed?)
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsLut(p, i) )
            pObj->Value = Gia_ObjPerformBidec( pManDec, pNew, p, pObj, vLeaves, vTruth, vVisited );
    }
    Bdc_ManFree( pManDec );
    // cleanup the AIG
    Gia_ManHashStop( pNew );
    // check the presence of dangling nodes
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        if ( Gia_ManAndNum(pNew) != Gia_ManAndNum(pTemp) )
            printf( "Gia_ManPerformBidec() node count before and after: %6d and %6d.\n", Gia_ManAndNum(pNew), Gia_ManAndNum(pTemp) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    if ( fVerbose )
    {
//        printf( "Total gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pNew) );
//        ABC_PRT( "Total runtime", Abc_Clock() - clk );
    }
    return pNew;
}